

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

void __thiscall clickhouse::BufferedOutput::~BufferedOutput(BufferedOutput *this)

{
  pointer puVar1;
  
  (this->super_ZeroCopyOutput).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutput_0016c390;
  DoFlush(this);
  ArrayOutput::~ArrayOutput(&this->array_output_);
  puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->buffer_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

BufferedOutput::~BufferedOutput() {
    Flush();
}